

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdf5_utils.cxx
# Opt level: O2

bool trento::hdf5::filename_is_hdf5(path *path)

{
  bool bVar1;
  char **ppcVar2;
  string asStack_58 [32];
  char *local_38;
  char *pcStack_30;
  char *pcStack_28;
  char *pcStack_20;
  
  bVar1 = boost::filesystem::path::has_extension(path);
  if (bVar1) {
    local_38 = ".hdf5";
    pcStack_30 = ".hdf";
    pcStack_28 = ".hd5";
    pcStack_20 = ".h5";
    boost::filesystem::path::extension();
    ppcVar2 = std::
              __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_equals_val<boost::filesystem::path_const>>
                        (&local_38,&stack0xffffffffffffffe8,asStack_58);
    std::__cxx11::string::~string(asStack_58);
    bVar1 = ppcVar2 != (char **)&stack0xffffffffffffffe8;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool filename_is_hdf5(const fs::path& path) {
  if (!path.has_extension())
    return false;

  auto hdf5_exts = {".hdf5", ".hdf", ".hd5", ".h5"};
  auto result = std::find(hdf5_exts.begin(), hdf5_exts.end(), path.extension());

  return result != hdf5_exts.end();
}